

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O1

void __thiscall
aggreports::WriteWheatsheafMean
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,int epcalc,int eptype,
          int eptype_tvar,
          map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
          *mean_map)

{
  _Rb_tree_color _Var1;
  pointer pmVar2;
  code *pcVar3;
  _Rb_tree_node_base *p_Var4;
  int iVar5;
  pointer pmVar6;
  long *plVar7;
  double dVar8;
  pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_> s;
  vector<mean_count,_std::allocator<mean_count>_> local_48;
  
  if ((mean_map->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    for (p_Var4 = (mean_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(mean_map->_M_t)._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      _Var1 = p_Var4[1]._M_color;
      std::vector<mean_count,_std::allocator<mean_count>_>::vector
                (&local_48,(vector<mean_count,_std::allocator<mean_count>_> *)&p_Var4[1]._M_parent);
      pmVar2 = local_48.super__Vector_base<mean_count,_std::allocator<mean_count>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pmVar6 = local_48.super__Vector_base<mean_count,_std::allocator<mean_count>_>._M_impl.
                    super__Vector_impl_data._M_start; pmVar6 != pmVar2; pmVar6 = pmVar6 + 1) {
        pcVar3 = (code *)this->WriteEPTOutput;
        if (pcVar3 != (code *)0x0) {
          plVar7 = (long *)((long)&this->totalperiods_ + *(long *)&this->field_0x158);
          if (((ulong)pcVar3 & 1) != 0) {
            pcVar3 = *(code **)(pcVar3 + *plVar7 + -1);
          }
          iVar5 = pmVar6->count;
          if (iVar5 < 2) {
            iVar5 = 1;
          }
          dVar8 = pmVar6->mean / (double)iVar5;
          (*pcVar3)(pmVar6->retperiod,CONCAT44((int)((ulong)dVar8 >> 0x20),(float)dVar8),plVar7,
                    fileIDs,_Var1,epcalc,eptype);
        }
      }
      if (local_48.super__Vector_base<mean_count,_std::allocator<mean_count>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<mean_count,_std::allocator<mean_count>_>._M_impl
                        .super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void aggreports::WriteWheatsheafMean(const std::vector<int> &fileIDs,
	int epcalc, int eptype, int eptype_tvar,
	std::map<int, std::vector<mean_count>> *mean_map) {

  if (mean_map->size() == 0) return;

#ifdef ORD_OUTPUT
  if (os_ept_exists_ == false) {
    if (parquetFileNames_[EPT] != "") {
      os_ept_ = GetParquetStreamWriter(EPT);
      os_ept_exists_ = true;
    }
  }
#endif

  for (auto s : *mean_map) {
    std::vector<mean_count> &rmc = s.second;
    int i = 1;

    for (auto mc : rmc) {

      if (WriteEPTOutput != nullptr) {
	(this->*WriteEPTOutput)(fileIDs, s.first, epcalc, eptype, mc.retperiod,
				mc.mean / std::max(mc.count, 1));
      }

#ifdef ORD_OUTPUT
      if (parquetFileNames_[EPT] != "") {
	WriteParquetOutput(os_ept_, s.first, epcalc, eptype, mc.retperiod,
			   mc.mean / std::max(mc.count, 1));
      }
#endif

      i++;

    }

  }

}